

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

SVInt slang::SVInt::fromDigits
                (bitwidth_t bits,LiteralBase base,bool isSigned,bool anyUnknown,
                span<const_slang::logic_t,_18446744073709551615UL> digits)

{
  byte bVar1;
  span<const_slang::logic_t,_18446744073709551615UL> digits_00;
  bool bVar2;
  bool bVar3;
  invalid_argument *piVar4;
  uint64_t value;
  long lVar6;
  undefined8 extraout_RDX;
  uint shift;
  uint bits_00;
  undefined7 in_register_00000031;
  undefined4 in_register_0000003c;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 this;
  sbyte sVar7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar8;
  size_t sVar9;
  SVInt SVar10;
  format_args args;
  span<const_slang::logic_t,_18446744073709551615UL> digits_01;
  string_view fmt;
  __extent_storage<18446744073709551615UL> in_stack_00000008;
  __extent_storage<18446744073709551615UL> in_stack_00000010;
  string local_68;
  uint local_48 [4];
  uint local_38;
  undefined8 uVar5;
  
  this.val._4_4_ = in_register_0000003c;
  this.val._0_4_ = bits;
  if (in_stack_00000010._M_extent_value == 0) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"No digits provided");
    goto LAB_001fa338;
  }
  sVar7 = 0;
  switch(isSigned) {
  case false:
    sVar7 = 1;
    shift = 2;
    break;
  case true:
    sVar7 = 3;
    shift = 8;
    break;
  case true:
    shift = 10;
    bVar2 = true;
    bVar3 = true;
    goto LAB_001fa1fa;
  case true:
    sVar7 = 4;
    shift = 0x10;
    break;
  default:
    bVar3 = true;
    bVar2 = false;
    shift = 0;
    goto LAB_001fa1fa;
  }
  bVar2 = false;
  bVar3 = false;
LAB_001fa1fa:
  bits_00 = (uint)CONCAT71(in_register_00000031,base);
  if (bits_00 < 0x41 && (char)digits._M_ptr == '\0') {
    sVar9 = 0;
    value = 0;
    do {
      bVar1 = ((pointer)(in_stack_00000008._M_extent_value + sVar9))->value;
      aVar8._1_7_ = 0;
      aVar8._0_1_ = bVar1;
      if ((byte)shift <= bVar1) {
        piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
        local_48[0] = (uint)((pointer)(in_stack_00000008._M_extent_value + sVar9))->value;
        args.field_1.values_ = aVar8.values_;
        args.desc_ = (unsigned_long_long)local_48;
        fmt.size_ = 0x22;
        fmt.data_ = (char *)0x1f;
        local_38 = shift;
        ::fmt::v11::vformat_abi_cxx11_(&local_68,(v11 *)"Digit {} too large for radix {}",fmt,args);
        std::invalid_argument::invalid_argument(piVar4,(string *)&local_68);
        __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      lVar6 = value << sVar7;
      if (bVar3) {
        lVar6 = value * shift;
      }
      value = (long)&(aVar8.values_)->field_0 + lVar6;
      sVar9 = sVar9 + 1;
    } while (in_stack_00000010._M_extent_value != sVar9);
    SVInt((SVInt *)this.pVal,bits_00,value,anyUnknown);
    uVar5 = extraout_RDX;
  }
  else if (bVar2) {
    if ((char)digits._M_ptr == '\0') {
      digits_01._M_extent._M_extent_value = in_stack_00000008._M_extent_value;
      digits_01._M_ptr = (pointer)(ulong)anyUnknown;
      SVar10 = fromDecimalDigits(bits,(bool)base,digits_01);
      uVar5 = SVar10.super_SVIntStorage._8_8_;
    }
    else {
      if (in_stack_00000010._M_extent_value != 1) {
        piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument
                  (piVar4,"If a decimal number is unknown, it must have exactly one digit.");
LAB_001fa338:
        __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      if (*(uint8_t *)in_stack_00000008._M_extent_value == '@') {
        SVar10 = createFillZ((SVInt *)this.pVal,bits_00,anyUnknown);
        uVar5 = SVar10.super_SVIntStorage._8_8_;
      }
      else {
        SVar10 = createFillX((SVInt *)this.pVal,bits_00,anyUnknown);
        uVar5 = SVar10.super_SVIntStorage._8_8_;
      }
    }
  }
  else {
    digits_00._M_extent._M_extent_value = in_stack_00000010._M_extent_value;
    digits_00._M_ptr = (pointer)in_stack_00000008._M_extent_value;
    SVar10 = fromPow2Digits(bits,(bool)base,anyUnknown,(uint)digits._M_ptr & 0xff,shift,digits_00);
    uVar5 = SVar10.super_SVIntStorage._8_8_;
  }
  SVar10.super_SVIntStorage.bitWidth = (int)uVar5;
  SVar10.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar5 >> 0x20);
  SVar10.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar5 >> 0x28);
  SVar10.super_SVIntStorage._14_2_ = (short)((ulong)uVar5 >> 0x30);
  SVar10.super_SVIntStorage.field_0.val = this.val;
  return (SVInt)SVar10.super_SVIntStorage;
}

Assistant:

SVInt SVInt::fromDigits(bitwidth_t bits, LiteralBase base, bool isSigned, bool anyUnknown,
                        std::span<logic_t const> digits) {
    if (digits.empty())
        SLANG_THROW(std::invalid_argument("No digits provided"));

    // Note: If the user specified a number too large to fit in the number of bits specified,
    // the spec says to truncate from the left, which this method will successfully do.

    uint32_t radix = 0;
    uint32_t shift = 0;
    switch (base) {
        case LiteralBase::Binary:
            radix = 2;
            shift = 1;
            break;
        case LiteralBase::Octal:
            radix = 8;
            shift = 3;
            break;
        case LiteralBase::Decimal:
            radix = 10;
            shift = 0; // can't actually shift for Decimal numbers
            break;
        case LiteralBase::Hex:
            radix = 16;
            shift = 4;
            break;
    }

    if (bits <= BITS_PER_WORD && !anyUnknown) {
        // Fast path for values that fit in one word:
        // let's do the computation entirely in a normal uint64_t instead
        // of having to do SVInt operations
        uint64_t val = 0;
        for (const logic_t& d : digits) {
            if (shift)
                val <<= shift;
            else
                val *= radix;

            val += d.value;
            if (d.value >= radix) {
                SLANG_THROW(std::invalid_argument(
                    fmt::format("Digit {} too large for radix {}", d.value, radix)));
            }
        }
        return SVInt(bits, val, isSigned);
    }

    if (radix == 10) {
        // In base ten we can't have individual bits be X or Z, it's all or nothing
        if (anyUnknown) {
            if (digits.size() != 1) {
                SLANG_THROW(std::invalid_argument(
                    "If a decimal number is unknown, it must have exactly one digit."));
            }

            if (exactlyEqual(digits[0], logic_t::z))
                return createFillZ(bits, isSigned);
            else
                return createFillX(bits, isSigned);
        }

        return fromDecimalDigits(bits, isSigned, digits);
    }

    return fromPow2Digits(bits, isSigned, anyUnknown, radix, shift, digits);
}